

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_gen_rand_all(dsfmt_t *dsfmt)

{
  w128_t *pwVar1;
  long lVar2;
  bool bVar3;
  w128_t lung;
  
  lung.u[0] = dsfmt->status[0xbf].u[0];
  lung.u[1] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
  do_recursion(dsfmt->status,dsfmt->status,dsfmt->status + 0x75,&lung);
  pwVar1 = dsfmt->status + 0x76;
  lVar2 = 0x49;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    do_recursion(pwVar1 + -0x75,pwVar1 + -0x75,pwVar1,&lung);
    pwVar1 = pwVar1 + 1;
  }
  lVar2 = 0x75;
  pwVar1 = dsfmt->status;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    do_recursion(pwVar1 + 0x4a,pwVar1 + 0x4a,pwVar1,&lung);
    pwVar1 = pwVar1 + 1;
  }
  dsfmt->status[0xbf].u[0] = lung.u[0];
  *(uint64_t *)((long)dsfmt->status + 0xbf8) = lung.u[1];
  return;
}

Assistant:

void dsfmt_gen_rand_all(dsfmt_t* dsfmt)
{
	int i;
	w128_t lung;

	lung = dsfmt->status[DSFMT_N];
	do_recursion(&dsfmt->status[0], &dsfmt->status[0],
	             &dsfmt->status[DSFMT_POS1], &lung);
	for (i = 1; i < DSFMT_N - DSFMT_POS1; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1], &lung);
	}
	for (; i < DSFMT_N; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1 - DSFMT_N], &lung);
	}
	dsfmt->status[DSFMT_N] = lung;
}